

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::ROL(m6502 *this)

{
  code *pcVar1;
  short sVar2;
  const_reference pvVar3;
  byte local_12;
  char cStack_11;
  uint16_t tmp;
  m6502 *this_local;
  
  fetch(this);
  sVar2 = (ushort)this->fetched * 2;
  local_12 = GetFlag(this,C);
  local_12 = (byte)sVar2 | local_12;
  cStack_11 = (char)((ushort)sVar2 >> 8);
  SetFlag(this,C,cStack_11 != '\0');
  SetFlag(this,Z,local_12 == 0);
  SetFlag(this,N,(bool)(local_12 >> 7));
  pvVar3 = std::vector<m6502::INSTRUCTION,_std::allocator<m6502::INSTRUCTION>_>::operator[]
                     (&this->lookup,(ulong)this->opcode);
  pcVar1 = (code *)pvVar3->addrmode;
  if (pcVar1 == IMP && (pcVar1 == (code *)0x0 || *(long *)&pvVar3->field_0x38 == 0)) {
    this->a = local_12;
  }
  else {
    write(this,(uint)this->addrAbs,(void *)(ulong)local_12,
          CONCAT62((int6)((ulong)pcVar1 >> 0x10),this->addrAbs));
  }
  return '\0';
}

Assistant:

uint8_t ROL()
  {
    fetch();
    uint16_t tmp = (uint16_t)(fetched << 1) | GetFlag(C);
    SetFlag(C, tmp & 0xFF00u);
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    if (lookup[opcode].addrmode == &m6502::IMP)
    {
      a = tmp & 0x00FFu;
    }
    else
    {
      write(addrAbs, tmp & 0x00FFu);
    }
    return 0;
  }